

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyfiledialogs.c
# Opt level: O1

char * terminalName(void)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  int *piVar4;
  char lShellName [64];
  undefined8 local_58;
  ulong uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  uStack_50 = 0;
  local_28 = 0;
  uStack_20 = 0;
  local_38 = 0;
  uStack_30 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0x2a;
  if (terminalName::lTerminalName[0] != '*') goto LAB_0011b241;
  iVar1 = detectPresence("bash");
  if (iVar1 == 0) {
    dialogNameOnly();
    if (dialogNameOnly::lDialogName[0] == '\0') {
      if (whiptailPresentOnly_lWhiptailPresent < 0) {
        whiptailPresentOnly_lWhiptailPresent = detectPresence("whiptail");
      }
      if (whiptailPresentOnly_lWhiptailPresent == 0) {
        terminalName::lTerminalName._0_4_ = terminalName::lTerminalName._0_4_ & 0xffffff00;
        return (char *)0x0;
      }
    }
    local_58 = CONCAT17(local_58._7_1_,0x20632d000000);
    local_58 = CONCAT44(local_58._4_4_,0x2d206873);
  }
  else {
    local_58 = 0x20632d2068736162;
    uStack_50 = uStack_50 & 0xffffffffffffff00;
  }
  iVar1 = isDarwin();
  if (iVar1 == 0) {
    builtin_strncpy(terminalName::lTerminalName,"xterm",6);
    iVar1 = detectPresence(terminalName::lTerminalName);
    if (iVar1 != 0) goto LAB_0011b1ff;
    builtin_strncpy(terminalName::lTerminalName,"terminator",0xb);
    iVar1 = detectPresence(terminalName::lTerminalName);
    if (iVar1 != 0) goto LAB_0011b28b;
    builtin_strncpy(terminalName::lTerminalName,"lxterminal",0xb);
    iVar1 = detectPresence(terminalName::lTerminalName);
    if (iVar1 == 0) {
      builtin_strncpy(terminalName::lTerminalName,"konsole",7);
      terminalName::lTerminalName._7_4_ = terminalName::lTerminalName._7_4_ & 0xffffff00;
      iVar1 = detectPresence(terminalName::lTerminalName);
      if (iVar1 != 0) goto LAB_0011b348;
      builtin_strncpy(terminalName::lTerminalName,"kterm",6);
      iVar1 = detectPresence(terminalName::lTerminalName);
      if (iVar1 != 0) goto LAB_0011b348;
      builtin_strncpy(terminalName::lTerminalName,"tilix",6);
      iVar1 = detectPresence(terminalName::lTerminalName);
      if (iVar1 != 0) goto LAB_0011b348;
      builtin_strncpy(terminalName::lTerminalName + 0xb,"nal",4);
      builtin_strncpy(terminalName::lTerminalName,"xfce4-termi",0xb);
      iVar1 = detectPresence(terminalName::lTerminalName);
      if (iVar1 != 0) {
LAB_0011b28b:
        sVar2 = strlen(terminalName::lTerminalName);
        builtin_strncpy(terminalName::lTerminalName + sVar2," -x ",4);
        goto LAB_0011b357;
      }
      builtin_strncpy(terminalName::lTerminalName,"mate-terminal",0xe);
      iVar1 = detectPresence(terminalName::lTerminalName);
      if (iVar1 != 0) goto LAB_0011b28b;
      builtin_strncpy(terminalName::lTerminalName,"Eterm",6);
      iVar1 = detectPresence(terminalName::lTerminalName);
      if (iVar1 != 0) goto LAB_0011b348;
      builtin_strncpy(terminalName::lTerminalName,"evilvte",7);
      terminalName::lTerminalName._7_4_ = terminalName::lTerminalName._7_4_ & 0xffffff00;
      iVar1 = detectPresence(terminalName::lTerminalName);
      if (iVar1 != 0) goto LAB_0011b348;
      builtin_strncpy(terminalName::lTerminalName,"pterm",6);
      iVar1 = detectPresence(terminalName::lTerminalName);
      if (iVar1 != 0) goto LAB_0011b348;
      builtin_strncpy(terminalName::lTerminalName + 0xb,"nal",4);
      builtin_strncpy(terminalName::lTerminalName,"gnome-termi",0xb);
      pcVar3 = terminalName::lTerminalName;
      iVar1 = detectPresence(terminalName::lTerminalName);
      if (((iVar1 == 0) || (piVar4 = getMajorMinorPatch(pcVar3), piVar4 == (int *)0x0)) ||
         ((2 < *piVar4 && ((*piVar4 != 3 || (6 < piVar4[1])))))) goto LAB_0011b1d0;
      sVar2 = strlen(terminalName::lTerminalName);
      builtin_strncpy(terminalName::lTerminalName + sVar2 + 0xf,"ory -x ",8);
      builtin_strncpy(terminalName::lTerminalName + sVar2," --disab",8);
      builtin_strncpy(terminalName::lTerminalName + sVar2 + 8,"le-facto",8);
    }
    else {
LAB_0011b348:
      sVar2 = strlen(terminalName::lTerminalName);
      builtin_strncpy(terminalName::lTerminalName + sVar2," -e ",4);
LAB_0011b357:
      terminalName::lTerminalName[sVar2 + 4] = '\0';
    }
  }
  else {
    builtin_strncpy(terminalName::lTerminalName,"/opt/X11/bin/xterm",0x13);
    iVar1 = detectPresence(terminalName::lTerminalName);
    if (iVar1 == 0) {
LAB_0011b1d0:
      terminalName::lTerminalName._0_4_ = terminalName::lTerminalName._0_4_ & 0xffffff00;
      goto LAB_0011b241;
    }
LAB_0011b1ff:
    sVar2 = strlen(terminalName::lTerminalName);
    builtin_strncpy(terminalName::lTerminalName + sVar2," -fa \'De",8);
    builtin_strncpy(terminalName::lTerminalName + sVar2 + 8,"jaVu San",8);
    builtin_strncpy(terminalName::lTerminalName + sVar2 + 0x10,"s Mono\' ",8);
    builtin_strncpy(terminalName::lTerminalName + sVar2 + 0x18,"-fs 10 -",8);
    builtin_strncpy(terminalName::lTerminalName + sVar2 + 0x20,"title ti",8);
    builtin_strncpy(terminalName::lTerminalName + sVar2 + 0x28,"nyfiledi",8);
    builtin_strncpy(terminalName::lTerminalName + sVar2 + 0x2a,"filedial",8);
    builtin_strncpy(terminalName::lTerminalName + sVar2 + 0x32,"ogs -e ",8);
  }
  strcat(terminalName::lTerminalName,(char *)&local_58);
LAB_0011b241:
  pcVar3 = (char *)0x0;
  if (terminalName::lTerminalName[0] != '\0') {
    pcVar3 = terminalName::lTerminalName;
  }
  return pcVar3;
}

Assistant:

static char const * terminalName( )
{
        static char lTerminalName[128] = "*" ;
        char lShellName[64] = "*" ;
        int * lArray;

        if ( lTerminalName[0] == '*' )
        {
                if ( detectPresence( "bash" ) )
                {
                        strcpy(lShellName , "bash -c " ) ; /*good for basic input*/
                }
				else if ( strlen(dialogNameOnly()) || whiptailPresentOnly() )
				{
						strcpy(lShellName , "sh -c " ) ; /*good enough for dialog & whiptail*/
				}
				else
				{
					strcpy(lTerminalName , "" ) ;
					return NULL ;
				}

                if ( isDarwin() )
                {
                        if ( strcpy(lTerminalName , "/opt/X11/bin/xterm" )
                      && detectPresence( lTerminalName ) )
                        {
                                strcat(lTerminalName , " -fa 'DejaVu Sans Mono' -fs 10 -title tinyfiledialogs -e " ) ;
                                strcat(lTerminalName , lShellName ) ;
                        }
                        else
                        {
                                strcpy(lTerminalName , "" ) ;
                        }
                }
                else if ( strcpy(lTerminalName,"xterm") /*good (small without parameters)*/
                        && detectPresence(lTerminalName) )
                {
                        strcat(lTerminalName , " -fa 'DejaVu Sans Mono' -fs 10 -title tinyfiledialogs -e " ) ;
                        strcat(lTerminalName , lShellName ) ;
                }
                else if ( strcpy(lTerminalName,"terminator") /*good*/
                          && detectPresence(lTerminalName) )
                {
                        strcat(lTerminalName , " -x " ) ;
                        strcat(lTerminalName , lShellName ) ;
                }
                else if ( strcpy(lTerminalName,"lxterminal") /*good*/
                          && detectPresence(lTerminalName) )
                {
                        strcat(lTerminalName , " -e " ) ;
                        strcat(lTerminalName , lShellName ) ;
                }
                else if ( strcpy(lTerminalName,"konsole") /*good*/
                          && detectPresence(lTerminalName) )
                {
                        strcat(lTerminalName , " -e " ) ;
                        strcat(lTerminalName , lShellName ) ;
                }
                else if ( strcpy(lTerminalName,"kterm") /*good*/
                          && detectPresence(lTerminalName) )
                {
                        strcat(lTerminalName , " -e " ) ;
                        strcat(lTerminalName , lShellName ) ;
                }
                else if ( strcpy(lTerminalName,"tilix") /*good*/
                          && detectPresence(lTerminalName) )
                {
                        strcat(lTerminalName , " -e " ) ;
                        strcat(lTerminalName , lShellName ) ;
                }
                else if ( strcpy(lTerminalName,"xfce4-terminal") /*good*/
                          && detectPresence(lTerminalName) )
                {
                        strcat(lTerminalName , " -x " ) ;
                        strcat(lTerminalName , lShellName ) ;
                }
                else if ( strcpy(lTerminalName,"mate-terminal") /*good*/
                          && detectPresence(lTerminalName) )
                {
                        strcat(lTerminalName , " -x " ) ;
                        strcat(lTerminalName , lShellName ) ;
                }
                else if ( strcpy(lTerminalName,"Eterm") /*good*/
                          && detectPresence(lTerminalName) )
                {
                        strcat(lTerminalName , " -e " ) ;
                        strcat(lTerminalName , lShellName ) ;
                }
                else if ( strcpy(lTerminalName,"evilvte") /*good*/
                          && detectPresence(lTerminalName) )
                {
                        strcat(lTerminalName , " -e " ) ;
                        strcat(lTerminalName , lShellName ) ;
                }
                else if ( strcpy(lTerminalName,"pterm") /*good (only letters)*/
                          && detectPresence(lTerminalName) )
                {
                        strcat(lTerminalName , " -e " ) ;
                        strcat(lTerminalName , lShellName ) ;
                }
                else if ( strcpy(lTerminalName,"gnome-terminal")
                && detectPresence(lTerminalName) && (lArray = getMajorMinorPatch(lTerminalName))
				&& ((lArray[0]<3) || (lArray[0]==3 && lArray[1]<=6)) )
                {
                        strcat(lTerminalName , " --disable-factory -x " ) ;
                        strcat(lTerminalName , lShellName ) ;
                }
                else
                {
                        strcpy(lTerminalName , "" ) ;
                }
                /* bad: koi rxterm guake tilda vala-terminal qterminal
                aterm Terminal terminology sakura lilyterm weston-terminal
                roxterm termit xvt rxvt mrxvt urxvt */
        }
        if ( strlen(lTerminalName) )
        {
                return lTerminalName ;
        }
        else
        {
                return NULL ;
        }
}